

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphDefn.h
# Opt level: O2

string * __thiscall
GdlGlyphDefn::GlyphIDString_abi_cxx11_
          (string *__return_storage_ptr__,GdlGlyphDefn *this,gid16 wGlyphID)

{
  ostream *poVar1;
  ostringstream strmStr;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&strmStr);
  poVar1 = (ostream *)std::ostream::operator<<((ostringstream *)&strmStr,(ushort)this);
  poVar1 = std::operator<<(poVar1," [0x");
  *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) =
       *(uint *)(&poVar1->field_0x18 + (long)poVar1->_vptr_basic_ostream[-3]) & 0xffffffb5 | 8;
  poVar1 = std::operator<<(poVar1,0x30);
  *(undefined8 *)(&poVar1->field_0x10 + (long)poVar1->_vptr_basic_ostream[-3]) = 4;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this);
  std::operator<<(poVar1,']');
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&strmStr);
  return __return_storage_ptr__;
}

Assistant:

static std::string GlyphIDString(gid16 wGlyphID)
	{
		std::ostringstream strmStr;
		strmStr	<< wGlyphID 
				<< " [0x" 
				<< std::hex << std::setfill('0') << std::setw(4) 
				<< wGlyphID << ']';

		return strmStr.str();
	}